

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.cpp
# Opt level: O3

JavascriptPromiseCapability *
Js::JavascriptPromise::CreatePromiseCapabilityRecord
          (RecyclableObject *constructor,ScriptContext *scriptContext)

{
  JavascriptLibrary *this;
  RecyclableObject *promise;
  bool bVar1;
  JavascriptPromiseCapability *capability;
  Var pvVar2;
  Arguments local_48;
  RecyclableObject *local_38;
  Var argVars [2];
  
  this = (scriptContext->super_ScriptContextBase).javascriptLibrary;
  promise = (this->super_JavascriptLibraryBase).undefinedValue.ptr;
  capability = JavascriptPromiseCapability::New(promise,promise,promise,scriptContext);
  argVars[0] = JavascriptLibrary::CreatePromiseCapabilitiesExecutorFunction
                         (this,EntryCapabilitiesExecutorFunction,capability);
  local_48.Values = &local_38;
  local_48.Info = (Type)0x3000002;
  local_38 = constructor;
  pvVar2 = JavascriptFunction::CallAsConstructor
                     (constructor,(Var)0x0,&local_48,scriptContext,(AuxArray<unsigned_int> *)0x0);
  bVar1 = JavascriptConversion::IsCallable((capability->resolve).ptr);
  if (bVar1) {
    bVar1 = JavascriptConversion::IsCallable((capability->reject).ptr);
    if (bVar1) {
      Memory::Recycler::WBSetBit((char *)&capability->promise);
      (capability->promise).ptr = pvVar2;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(&capability->promise);
      return capability;
    }
  }
  JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec76,L"Promise");
}

Assistant:

JavascriptPromiseCapability* JavascriptPromise::CreatePromiseCapabilityRecord(RecyclableObject* constructor, ScriptContext* scriptContext)
    {
        JavascriptLibrary* library = scriptContext->GetLibrary();
        Var undefinedVar = library->GetUndefined();
        JavascriptPromiseCapability* promiseCapability = JavascriptPromiseCapability::New(undefinedVar, undefinedVar, undefinedVar, scriptContext);

        JavascriptPromiseCapabilitiesExecutorFunction* executor = library->CreatePromiseCapabilitiesExecutorFunction(EntryCapabilitiesExecutorFunction, promiseCapability);

        CallInfo callinfo = Js::CallInfo((Js::CallFlags)(Js::CallFlags::CallFlags_Value | Js::CallFlags::CallFlags_New), 2);
        Var argVars[] = { constructor, executor };
        Arguments args(callinfo, argVars);
        Var promise = JavascriptFunction::CallAsConstructor(constructor, nullptr, args, scriptContext);

        if (!JavascriptConversion::IsCallable(promiseCapability->GetResolve()) || !JavascriptConversion::IsCallable(promiseCapability->GetReject()))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedFunction, _u("Promise"));
        }

        promiseCapability->SetPromise(promise);

        return promiseCapability;
    }